

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QTzType>::resize(QList<QTzType> *this,qsizetype size)

{
  QTzType *pQVar1;
  Data *pDVar2;
  QTzType *pQVar3;
  QTzType QVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QTzType>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QTzType **)0x0,
               (QArrayDataPointer<QTzType> *)0x0);
    lVar8 = (this->d).size;
  }
  else {
    lVar8 = (this->d).size;
    if (size < lVar8) goto LAB_00401736;
  }
  if (size <= lVar8) {
    return;
  }
  pQVar3 = (this->d).ptr;
  pQVar1 = pQVar3 + lVar8;
  pQVar1->tz_gmtoff = 0;
  auVar6 = _DAT_004c9270;
  auVar5 = _DAT_004c80d0;
  pQVar1->tz_isdst = false;
  pQVar1->tz_abbrind = '\0';
  *(undefined2 *)&pQVar1->field_0x6 = 0;
  if (pQVar1 + 1 != pQVar3 + size) {
    pQVar3 = pQVar3 + lVar8;
    uVar7 = (size * 8 + lVar8 * -8) - 0x10;
    auVar12._8_4_ = (int)uVar7;
    auVar12._0_8_ = uVar7;
    auVar12._12_4_ = (int)(uVar7 >> 0x20);
    auVar10._0_8_ = uVar7 >> 3;
    auVar10._8_8_ = auVar12._8_8_ >> 3;
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_004c80d0;
    do {
      auVar11._8_4_ = (int)uVar9;
      auVar11._0_8_ = uVar9;
      auVar11._12_4_ = (int)(uVar9 >> 0x20);
      auVar12 = (auVar11 | auVar6) ^ auVar5;
      QVar4 = *pQVar3;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        pQVar3[uVar9 + 1] = QVar4;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        pQVar3[uVar9 + 2] = QVar4;
      }
      uVar9 = uVar9 + 2;
    } while (((uVar7 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
  }
LAB_00401736:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }